

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::_::ForkHubBase::fire(ForkHubBase *this)

{
  PromiseArenaMember *node;
  long lVar1;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *pEVar2;
  Event *extraout_RDX_01;
  long in_RSI;
  Exception *exception;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar3;
  NullableValue<kj::Exception> _exception2570;
  
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x18))
            (*(long **)(in_RSI + 0x58),*(undefined8 *)(in_RSI + 0x60));
  node = *(PromiseArenaMember **)(in_RSI + 0x58);
  pEVar2 = extraout_RDX;
  if (node != (PromiseArenaMember *)0x0) {
    *(undefined8 *)(in_RSI + 0x58) = 0;
    PromiseDisposer::dispose(node);
    pEVar2 = extraout_RDX_00;
  }
  for (lVar1 = *(long *)(in_RSI + 0x68); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x20)) {
    PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(lVar1 + 0x10));
    **(undefined8 **)(lVar1 + 0x28) = 0;
    *(undefined8 *)(lVar1 + 0x28) = 0;
    pEVar2 = extraout_RDX_01;
  }
  **(undefined8 **)(in_RSI + 0x70) = 0;
  *(undefined8 *)(in_RSI + 0x70) = 0;
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)0x0;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
  MVar3.ptr.ptr = pEVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> ForkHubBase::fire() {
  // Dependency is ready.  Fetch its result and then delete the node.
  inner->get(resultRef);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    inner = nullptr;
  })) {
    resultRef.addException(kj::mv(exception));
  }

  for (auto branch = headBranch; branch != nullptr; branch = branch->next) {
    branch->hubReady();
    *branch->prevPtr = nullptr;
    branch->prevPtr = nullptr;
  }
  *tailBranch = nullptr;

  // Indicate that the list is no longer active.
  tailBranch = nullptr;

  return kj::none;
}